

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::AsyncCase::AsyncCase
          (AsyncCase *this,Context *ctx,char *name,char *desc,
          vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
          *errorFuncs,bool useCallbacks)

{
  _Rb_tree_header *p_Var1;
  
  BaseCase::BaseCase(&this->super_BaseCase,ctx,name,"Async message generation");
  (this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__AsyncCase_00a08460;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  ::vector(&this->m_errorFuncs,
           (vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
            *)desc);
  this->m_useCallbacks = SUB81(errorFuncs,0);
  (this->m_counts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_counts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_counts)._M_t._M_impl.super__Rb_tree_header;
  (this->m_counts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_counts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_counts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  de::Mutex::Mutex(&this->m_mutex,0);
  return;
}

Assistant:

AsyncCase::AsyncCase (Context&								ctx,
					  const char*							name,
					  const char*							desc,
					  const vector<TestFunctionWrapper>&	errorFuncs,
					  bool									useCallbacks)
	: BaseCase			(ctx, name, desc)
	, m_errorFuncs		(errorFuncs)
	, m_useCallbacks	(useCallbacks)
{
}